

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extract.cpp
# Opt level: O0

bool __thiscall anon_unknown.dwarf_2b41b::file_output::calculate_checksum(file_output *this)

{
  bool bVar1;
  byte bVar2;
  unsigned_long *puVar3;
  long lVar4;
  logger *this_00;
  long in_RDI;
  streamsize n;
  char buffer [8192];
  uint64_t diff;
  uint64_t max;
  undefined4 in_stack_ffffffffffffde08;
  log_level in_stack_ffffffffffffde0c;
  file_output *in_stack_ffffffffffffde10;
  char *in_stack_ffffffffffffde18;
  hasher *in_stack_ffffffffffffde20;
  logger *in_stack_ffffffffffffdf40;
  undefined1 local_2028 [8200];
  unsigned_long local_20 [3];
  bool local_1;
  
  bVar1 = has_checksum(in_stack_ffffffffffffde10);
  if (bVar1) {
    local_1 = true;
  }
  else if ((*(byte *)(in_RDI + 0x2c0) & 1) == 0) {
    local_1 = false;
  }
  else {
    local_20[1] = 0x1fffffffffffffff;
    local_20[0] = *(unsigned_long *)(in_RDI + 0x2a8);
    puVar3 = std::min<unsigned_long>(local_20,local_20 + 1);
    std::istream::seekg(in_RDI + 0x28,(_Ios_Seekdir)*puVar3);
    puVar3 = std::min<unsigned_long>(local_20,local_20 + 1);
    for (local_20[0] = local_20[0] - *puVar3; local_20[0] != 0; local_20[0] = local_20[0] - *puVar3)
    {
      puVar3 = std::min<unsigned_long>(local_20,local_20 + 1);
      std::istream::seekg(in_RDI + 0x28,(_Ios_Seekdir)*puVar3);
      puVar3 = std::min<unsigned_long>(local_20,local_20 + 1);
    }
    while (bVar2 = std::ios::eof(), ((bVar2 ^ 0xff) & 1) != 0) {
      std::istream::read((char *)(in_RDI + 0x28),(long)local_2028);
      lVar4 = std::istream::gcount();
      crypto::hasher::update
                (in_stack_ffffffffffffde20,in_stack_ffffffffffffde18,
                 (size_t)in_stack_ffffffffffffde10);
      *(long *)(in_RDI + 0x2a8) = lVar4 + *(long *)(in_RDI + 0x2a8);
    }
    bVar1 = has_checksum(in_stack_ffffffffffffde10);
    if (bVar1) {
      local_1 = true;
    }
    else {
      logger::logger((logger *)in_stack_ffffffffffffde10,in_stack_ffffffffffffde0c);
      logger::operator<<((logger *)in_stack_ffffffffffffde10,
                         (char (*) [10])
                         CONCAT44(in_stack_ffffffffffffde0c,in_stack_ffffffffffffde08));
      this_00 = logger::operator<<((logger *)in_stack_ffffffffffffde10,
                                   (path *)CONCAT44(in_stack_ffffffffffffde0c,
                                                    in_stack_ffffffffffffde08));
      logger::operator<<(this_00,(char (*) [10])
                                 CONCAT44(in_stack_ffffffffffffde0c,in_stack_ffffffffffffde08));
      logger::~logger(in_stack_ffffffffffffdf40);
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

bool calculate_checksum() {
		
		if(has_checksum()) {
			return true;
		}
		
		if(!write_) {
			return false;
		}
		
		debug("calculating output checksum for " << path_);
		
		const boost::uint64_t max = boost::uint64_t(std::numeric_limits<util::fstream::off_type>::max() / 4);
		
		boost::uint64_t diff = checksum_position_;
		stream_.seekg(util::fstream::off_type(std::min(diff, max)), std::ios_base::beg);
		diff -= std::min(diff, max);
		while(diff > 0) {
			stream_.seekg(util::fstream::off_type(std::min(diff, max)), std::ios_base::cur);
			diff -= std::min(diff, max);
		}
		
		while(!stream_.eof()) {
			char buffer[8192];
			std::streamsize n = stream_.read(buffer, sizeof(buffer)).gcount();
			checksum_.update(buffer, size_t(n));
			checksum_position_ += boost::uint64_t(n);
		}
		
		if(!has_checksum()) {
			log_warning << "Could not read back " << path_ << " to calculate output checksum for multi-part file";
			return false;
		}
		
		return true;
	}